

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c.cc
# Opt level: O0

leveldb_filterpolicy_t *
leveldb_filterpolicy_create
          (void *state,_func_void_void_ptr *destructor,
          _func_char_ptr_void_ptr_char_ptr_ptr_size_t_ptr_int_size_t_ptr *create_filter,
          _func_uchar_void_ptr_char_ptr_size_t_char_ptr_size_t *key_may_match,
          _func_char_ptr_void_ptr *name)

{
  leveldb_filterpolicy_t *this;
  leveldb_filterpolicy_t *result;
  _func_char_ptr_void_ptr *name_local;
  _func_uchar_void_ptr_char_ptr_size_t_char_ptr_size_t *key_may_match_local;
  _func_char_ptr_void_ptr_char_ptr_ptr_size_t_ptr_int_size_t_ptr *create_filter_local;
  _func_void_void_ptr *destructor_local;
  void *state_local;
  
  this = (leveldb_filterpolicy_t *)operator_new(0x30);
  leveldb_filterpolicy_t::leveldb_filterpolicy_t(this);
  this->state_ = state;
  this->destructor_ = destructor;
  this->create_ = create_filter;
  this->key_match_ = key_may_match;
  this->name_ = name;
  return this;
}

Assistant:

leveldb_filterpolicy_t* leveldb_filterpolicy_create(
    void* state, void (*destructor)(void*),
    char* (*create_filter)(void*, const char* const* key_array,
                           const size_t* key_length_array, int num_keys,
                           size_t* filter_length),
    unsigned char (*key_may_match)(void*, const char* key, size_t length,
                                   const char* filter, size_t filter_length),
    const char* (*name)(void*)) {
  leveldb_filterpolicy_t* result = new leveldb_filterpolicy_t;
  result->state_ = state;
  result->destructor_ = destructor;
  result->create_ = create_filter;
  result->key_match_ = key_may_match;
  result->name_ = name;
  return result;
}